

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

string * __thiscall
jsonip::parser::IStreamReader::to_string_abi_cxx11_
          (string *__return_storage_ptr__,IStreamReader *this,undefined8 param_3,undefined8 param_4,
          size_type param_5)

{
  istream *piVar1;
  reference pcVar2;
  undefined1 auVar3 [16];
  allocator<char> local_b9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  allocator_type local_59;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> buffer;
  streampos old;
  undefined4 uStack_34;
  size_t size_local;
  IStreamReader *this_local;
  PositionType p_local;
  undefined4 uStack_14;
  
  auVar3 = std::istream::tellg();
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = auVar3._0_8_;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_58,param_5,&local_59);
  std::allocator<char>::~allocator(&local_59);
  this_local._0_4_ = (undefined4)param_3;
  this_local._4_4_ = (undefined4)((ulong)param_3 >> 0x20);
  _p_local = (undefined4)param_4;
  uStack_14 = (undefined4)((ulong)param_4 >> 0x20);
  local_88 = this_local._0_4_;
  uStack_84 = this_local._4_4_;
  uStack_80 = _p_local;
  uStack_7c = uStack_14;
  std::istream::seekg(this->in_,param_3,param_4);
  piVar1 = this->in_;
  local_90._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_58);
  pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&local_90);
  std::istream::read((char *)piVar1,(long)pcVar2);
  _old = auVar3._8_4_;
  uStack_34 = auVar3._12_4_;
  local_a8 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
  uStack_a4 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  uStack_a0 = _old;
  uStack_9c = uStack_34;
  std::istream::seekg(this->in_,
                      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                      auVar3._8_8_);
  local_b0._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_58);
  local_b8._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)__return_storage_ptr__,local_b0,local_b8,&local_b9);
  std::allocator<char>::~allocator(&local_b9);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(PositionType p, std::size_t size)
        {
            const std::streampos old = in_.tellg();

            std::vector<char> buffer(size);
            in_.seekg(p);
            in_.read(&*buffer.begin(), size);
            in_.seekg(old);

            return std::string(buffer.begin(), buffer.end());
        }